

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_reaper.cc
# Opt level: O0

void __thiscall
sptk::PitchExtractionByReaper::PitchExtractionByReaper
          (PitchExtractionByReaper *this,int frame_shift,double sampling_rate,double lower_f0,
          double upper_f0,double voicing_threshold)

{
  undefined4 in_ESI;
  PitchExtractionInterface *in_RDI;
  _func_int **in_XMM0_Qa;
  _func_int **in_XMM1_Qa;
  _func_int **in_XMM2_Qa;
  _func_int **in_XMM3_Qa;
  
  PitchExtractionInterface::PitchExtractionInterface(in_RDI);
  in_RDI->_vptr_PitchExtractionInterface = (_func_int **)&PTR__PitchExtractionByReaper_00172b18;
  *(undefined4 *)&in_RDI[1]._vptr_PitchExtractionInterface = in_ESI;
  in_RDI[2]._vptr_PitchExtractionInterface = in_XMM0_Qa;
  in_RDI[3]._vptr_PitchExtractionInterface = in_XMM1_Qa;
  in_RDI[4]._vptr_PitchExtractionInterface = in_XMM2_Qa;
  in_RDI[5]._vptr_PitchExtractionInterface = in_XMM3_Qa;
  *(undefined1 *)&in_RDI[6]._vptr_PitchExtractionInterface = 1;
  if ((((*(int *)&in_RDI[1]._vptr_PitchExtractionInterface < 1) ||
       ((double)in_RDI[2]._vptr_PitchExtractionInterface / 2.0 <=
        (double)in_RDI[4]._vptr_PitchExtractionInterface)) ||
      ((double)in_RDI[2]._vptr_PitchExtractionInterface <= 6000.0)) ||
     (((98000.0 < (double)in_RDI[2]._vptr_PitchExtractionInterface ||
       ((double)in_RDI[3]._vptr_PitchExtractionInterface <= 10.0)) ||
      ((double)in_RDI[4]._vptr_PitchExtractionInterface <=
       (double)in_RDI[3]._vptr_PitchExtractionInterface)))) {
    *(undefined1 *)&in_RDI[6]._vptr_PitchExtractionInterface = 0;
  }
  return;
}

Assistant:

PitchExtractionByReaper::PitchExtractionByReaper(int frame_shift,
                                                 double sampling_rate,
                                                 double lower_f0,
                                                 double upper_f0,
                                                 double voicing_threshold)
    : frame_shift_(frame_shift),
      sampling_rate_(sampling_rate),
      lower_f0_(lower_f0),
      upper_f0_(upper_f0),
      voicing_threshold_(voicing_threshold),
      is_valid_(true) {
  if (frame_shift_ <= 0 || sampling_rate_ / 2 <= upper_f0_ ||
      (sampling_rate_ <= reaper::kMinSampleRate || 98000.0 < sampling_rate_) ||
      (lower_f0_ <= 10.0 || upper_f0_ <= lower_f0_)) {
    is_valid_ = false;
    return;
  }
}